

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::moveFromSpan
          (Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_> *this,
          Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_> *fromSpan,size_t fromIndex,size_t to)

{
  byte bVar1;
  uchar uVar2;
  Entry *this_00;
  uchar *puVar3;
  Entry *this_01;
  Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Entry *fromEntry;
  size_t fromOffset;
  Entry *toEntry;
  
  if (*(char *)(in_RDI + 0x89) == *(char *)(in_RDI + 0x88)) {
    addStorage(in_RCX);
  }
  in_RCX->offsets[in_RDI] = *(uchar *)(in_RDI + 0x89);
  this_00 = (Entry *)(*(long *)(in_RDI + 0x80) + (ulong)*(byte *)(in_RDI + 0x89) * 0x30);
  puVar3 = Entry::nextFree(this_00);
  *(uchar *)(in_RDI + 0x89) = *puVar3;
  bVar1 = *(byte *)(in_RSI + in_RDX);
  *(undefined1 *)(in_RSI + in_RDX) = 0xff;
  this_01 = (Entry *)(*(long *)(in_RSI + 0x80) + (ulong)bVar1 * 0x30);
  memcpy(this_00,this_01,0x30);
  uVar2 = *(uchar *)(in_RSI + 0x89);
  puVar3 = Entry::nextFree(this_01);
  *puVar3 = uVar2;
  *(byte *)(in_RSI + 0x89) = bVar1;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }